

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::aLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  clock_t cVar6;
  size_type sVar7;
  ulong uVar8;
  Station *this_00;
  reference pvVar9;
  long lVar10;
  clock_t cVar11;
  void *this_01;
  byte in_DL;
  Plan *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  Plan *P_00;
  bool completed;
  int sign;
  int beamlet;
  int aperture;
  int best_n;
  int j;
  int i;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> best_move;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> tabu;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  bool best_improvement;
  bool improvement;
  double current_eval;
  double aux_eval;
  double local_best_eval;
  double used_time;
  clock_t time_begin;
  clock_t time_end;
  Station *s;
  int in_stack_fffffffffffffd8c;
  Plan *in_stack_fffffffffffffd90;
  Plan *this_02;
  Station *in_stack_fffffffffffffd98;
  Plan *in_stack_fffffffffffffda0;
  Plan *in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  Station *in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  ApertureILS *in_stack_fffffffffffffe18;
  Station *in_stack_fffffffffffffea8;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Station *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  ApertureILS *in_stack_ffffffffffffff58;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  local_78;
  byte local_5a;
  byte local_59;
  double local_58;
  
  bVar4 = in_DL & 1;
  local_59 = 1;
  local_5a = *(int *)(in_RDI + 0x34) != 0;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)0x163cdd);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::
  pair<std::pair<int,_int>,_std::pair<int,_int>,_true>
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)in_stack_fffffffffffffd90);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::
  pair<std::pair<int,_int>,_std::pair<int,_int>,_true>
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)in_stack_fffffffffffffd90);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x163d08);
  bVar3 = false;
  iVar13 = -1;
  iVar15 = -1;
  P_00 = (Plan *)Plan::getEvaluation(in_RSI);
  this_02 = P_00;
  if (bVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Staring aperture local search...");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  cVar6 = clock();
  do {
    if ((local_59 & 1) == 0) goto LAB_0016471b;
    iVar15 = iVar15 + 1;
    getShuffledApertureNeighbors((ApertureILS *)this_02,P_00);
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::operator=((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 *)in_stack_fffffffffffffda0,
                (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 *)in_stack_fffffffffffffd98);
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::~vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               *)in_stack_fffffffffffffda0);
    local_59 = 0;
    bVar3 = false;
    if (bVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Neighborhood ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar15);
      poVar5 = std::operator<<(poVar5," size ");
      sVar7 = std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::size(&local_78);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
      poVar5 = std::operator<<(poVar5,"    current ");
      in_stack_fffffffffffffea8 = (Station *)std::ostream::operator<<(poVar5,(double)this_02);
      std::ostream::operator<<(in_stack_fffffffffffffea8,std::endl<char,std::char_traits<char>>);
    }
    local_58 = Plan::getEvaluation(in_RSI);
    for (iVar16 = 0; uVar8 = (ulong)iVar16,
        sVar7 = std::
                vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::size(&local_78), uVar8 < sVar7; iVar16 = iVar16 + 1) {
      std::
      vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ::operator[](&local_78,(long)iVar16);
      this_00 = Plan::get_station(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      pvVar9 = std::
               vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ::operator[](&local_78,(long)iVar16);
      iVar12 = (pvVar9->first).second;
      pvVar9 = std::
               vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ::operator[](&local_78,(long)iVar16);
      iVar1 = (pvVar9->second).second;
      pvVar9 = std::
               vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ::operator[](&local_78,(long)iVar16);
      iVar2 = (pvVar9->second).first;
      if (iVar2 < 0) {
        P_00 = (Plan *)closeBeamlet(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                    in_stack_ffffffffffffff40,(double)CONCAT44(iVar16,iVar15),
                                    (Plan *)CONCAT44(iVar13,iVar12));
        iVar14 = iVar13;
        iVar13 = iVar16;
      }
      else {
        P_00 = (Plan *)openBeamlet(in_stack_fffffffffffffe18,
                                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                   (int)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                   (double)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        iVar14 = iVar13;
        iVar13 = iVar16;
      }
      if (bVar4 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"  aLS Neighbor ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar13);
        poVar5 = std::operator<<(poVar5," over station ");
        iVar16 = Station::getAngle(this_00);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar16);
        poVar5 = std::operator<<(poVar5," aperture ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar12);
        poVar5 = std::operator<<(poVar5," beamlet ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5," operator ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        in_stack_fffffffffffffe18 = (ApertureILS *)std::operator<<(poVar5," result ");
        in_stack_fffffffffffffe10 =
             (void *)std::ostream::operator<<(in_stack_fffffffffffffe18,(double)P_00);
        std::ostream::operator<<(in_stack_fffffffffffffe10,std::endl<char,std::char_traits<char>>);
      }
      iVar16 = iVar13;
      if (1e-05 < (double)this_02 - (double)P_00) {
        local_59 = 1;
        this_02 = P_00;
        if (bVar4 != 0) {
          in_stack_fffffffffffffe08 =
               (Station *)std::operator<<((ostream *)&std::cout,"     improvement ");
          in_stack_fffffffffffffe00 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffe08,(double)P_00);
          std::ostream::operator<<(in_stack_fffffffffffffe00,std::endl<char,std::char_traits<char>>)
          ;
        }
        iVar14 = iVar13;
        if ((local_5a & 1) == 0) {
          in_stack_fffffffffffffdf8 = (Plan *)(long)iVar16;
          sVar7 = std::
                  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::size(&local_78);
          if (in_stack_fffffffffffffdf8 == (Plan *)(sVar7 - 1)) {
            bVar3 = true;
          }
          sVar7 = std::
                  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::size(&local_78);
          iVar16 = (int)sVar7;
          break;
        }
      }
      iVar13 = iVar14;
      Station::undoLast_abi_cxx11_(in_stack_fffffffffffffea8);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffda0,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffd98);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1643df)
      ;
      sVar7 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffd90);
      if (sVar7 != 0) {
        P_00 = (Plan *)Plan::incremental_eval
                                 (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   *)in_stack_fffffffffffffd90);
      }
      lVar10 = (long)iVar16;
      sVar7 = std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::size(&local_78);
      if (lVar10 == sVar7 - 1) {
        bVar3 = true;
      }
      cVar11 = clock();
      if (((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) &&
         (in_XMM0_Qa <= (double)(cVar11 - cVar6) / 1000000.0)) {
        if (bVar4 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"  aLS timed out ");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        break;
      }
    }
    if (((local_59 & 1) != 0) && ((local_5a & 1) != 0)) {
      std::
      vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ::operator[](&local_78,(long)iVar13);
      Plan::get_station(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      pvVar9 = std::
               vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ::operator[](&local_78,(long)iVar13);
      iVar12 = (pvVar9->first).second;
      std::
      vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ::operator[](&local_78,(long)iVar13);
      pvVar9 = std::
               vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ::operator[](&local_78,(long)iVar13);
      if ((pvVar9->second).first < 0) {
        P_00 = (Plan *)closeBeamlet(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                    in_stack_ffffffffffffff40,(double)CONCAT44(iVar16,iVar15),
                                    (Plan *)CONCAT44(iVar13,iVar12));
      }
      else {
        P_00 = (Plan *)openBeamlet(in_stack_fffffffffffffe18,
                                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                   (int)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                   (double)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
    }
    cVar11 = clock();
  } while (((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) ||
          ((double)(cVar11 - cVar6) / 1000000.0 < in_XMM0_Qa));
  if (bVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"  aLS timed out ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
LAB_0016471b:
  poVar5 = std::operator<<((ostream *)&std::cout,"  aLS best: ");
  std::ostream::operator<<(poVar5,(double)this_02);
  if (bVar3) {
    std::operator<<((ostream *)&std::cout,": [lo] : ");
  }
  else {
    std::operator<<((ostream *)&std::cout,": [nolo] : ");
  }
  cVar11 = clock();
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,in_XMM0_Qa);
  poVar5 = std::operator<<(poVar5," :");
  this_01 = (void *)std::ostream::operator<<(poVar5,(double)(cVar11 - cVar6) / 1000000.0);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x164839);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             *)poVar5);
  return (double)this_02;
}

Assistant:

double ApertureILS::aLocalSearch(Plan& P, double max_time, bool verbose) {
  Station *s;
  std::clock_t time_end, time_begin;
  double used_time;
  double local_best_eval, aux_eval, current_eval;
  bool improvement=true, best_improvement=ls_type;
  vector < pair< pair<int, int>, pair<int, int>> > a_list;
  pair< pair<int, int>, pair<int, int>> tabu;
  pair< pair<int, int>, pair<int,int>> best_move;
  list<pair<int, double> > diff;
  int i,j, best_n, aperture, beamlet, sign;
  bool completed = false;
  best_n = -1;
  j=-1;
  local_best_eval = aux_eval= P.getEvaluation();
  if (verbose)
    cout << "Staring aperture local search..." << endl;
  
  time_begin=clock();
  
  while (improvement) {
    j++;
    a_list = getShuffledApertureNeighbors(P);
    //a_list = getOrderedApertureNeighbors(P);
    improvement = false;
    completed = false;
    
    if (verbose)
      cout << "Neighborhood "<<j<< " size "<< a_list.size() << "    current " << local_best_eval << endl;
    
    current_eval = P.getEvaluation();
    for (i = 0; i < a_list.size(); i++) {
      s = P.get_station(a_list[i].first.first);
      aperture = a_list[i].first.second;
      beamlet = a_list[i].second.second;
      sign = a_list[i].second.first;
            
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, current_eval, P); 
      } else {
        aux_eval = openBeamlet(beamlet, aperture, *s, current_eval, P);
      }

      if (verbose) {
          cout << "  aLS Neighbor " << i << " over station " << s->getAngle() << " aperture " << aperture << " beamlet " << beamlet << " operator " << sign << " result " << aux_eval << endl;
      }

      if ((local_best_eval - aux_eval) > 0.00001){
        local_best_eval = aux_eval;
        best_n = i;
        improvement = true;
        if (verbose)
          cout << "     improvement " << aux_eval << endl ;
        if (!best_improvement) { 
          if (i==(a_list.size()-1)) completed=true;
          i = a_list.size();
          break;
        }
      }

      diff = s->undoLast();
      if (diff.size() > 0)
        aux_eval = P.incremental_eval(*s, diff);
      
      if (i==(a_list.size()-1)) completed=true;
      
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        if (verbose)
          cout << "  aLS timed out " << endl;
        break;
      }
      
    }
    
    //Apply best neighbor
    if (improvement && best_improvement) {
      s = P.get_station(a_list[best_n].first.first);
      aperture = a_list[best_n].first.second;
      beamlet = a_list[best_n].second.second;
      sign = a_list[best_n].second.first;
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, aux_eval, P);
      } else{
        aux_eval = openBeamlet(beamlet, aperture, *s, aux_eval, P);
      }
    }
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    if (max_time!=0 && used_time >= max_time) {
      if (verbose)
        cout << "  aLS timed out " << endl;
      break;
    }
  }
  
  cout << "  aLS best: " << local_best_eval ;
  if (!completed) cout << ": [nolo] : ";
  else  cout << ": [lo] : ";
  time_end = clock();
  used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
  cout << max_time << " :" << used_time << endl;
  
  return(local_best_eval);
}